

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O1

int __thiscall sparse_tree::b(sparse_tree *this,int i,int l)

{
  uint uVar1;
  pointer pNVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  ulong uVar7;
  
  pNVar2 = (this->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = (pNVar2[l].parent)->index;
  iVar5 = -2;
  if ((iVar4 != 0) && (pNVar2[l].pair < 0)) {
    uVar7 = (ulong)(uint)i;
    iVar5 = -1;
    if ((i <= iVar4) && (iVar4 = LCA(this,i,l), iVar5 = i, iVar4 != i)) {
      iVar5 = -100;
      for (puVar6 = *(uint **)&pNVar2[iVar4].children.super__Vector_base<int,_std::allocator<int>_>;
          puVar6 != *(uint **)((long)&pNVar2[iVar4].children.
                                      super__Vector_base<int,_std::allocator<int>_> + 8);
          puVar6 = puVar6 + 1) {
        uVar1 = *puVar6;
        if (((int)uVar1 < l) && (l < pNVar2[(int)uVar1].pair)) {
          bVar3 = false;
          uVar7 = (ulong)uVar1;
        }
        else {
          bVar3 = true;
        }
        if (!bVar3) {
          return (int)uVar7;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

const int sparse_tree::b(int i, int l) const{
    if(tree[l].parent->index == 0 || tree[l].pair > -1) return -2;
    if ((tree[l].parent)->index < i) return -1;
    else{
        int lca = LCA(i,l);
        if(i==lca) return i;

        for(int x:tree[lca].children){
            if(x<l && tree[x].pair > l) return x;
        }
        return -100;
    }
}